

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * jx9_context_new_array(jx9_context *pCtx)

{
  jx9_value *local_18;
  jx9_value *pVal;
  jx9_context *pCtx_local;
  
  pVal = (jx9_value *)pCtx;
  local_18 = jx9_new_array(pCtx->pVm);
  if (local_18 != (jx9_value *)0x0) {
    SySetPut((SySet *)&pVal->pVm,&local_18);
  }
  return local_18;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_context_new_array(jx9_context *pCtx)
{
	jx9_value *pVal;
	pVal = jx9_new_array(pCtx->pVm);
	if( pVal ){
		/* Record value address so it can be freed automatically
		 * when the calling function returns. 
		 */
		SySetPut(&pCtx->sVar, (const void *)&pVal);
	}
	return pVal;
}